

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_back.hpp
# Opt level: O0

type_conflict1
sl::functional::detail::call_bind_back<std::greater<void>&,std::tuple<int>&,int&>
          (greater<void> *func,tuple<int> *boundArgsTuple,int *callArgs)

{
  type_conflict1 tVar1;
  anon_class_16_2_27d33730 local_30;
  int *local_20;
  int *callArgs_local;
  tuple<int> *boundArgsTuple_local;
  greater<void> *func_local;
  
  local_30.func = func;
  local_30.callArgs = callArgs;
  local_20 = callArgs;
  callArgs_local = (int *)boundArgsTuple;
  boundArgsTuple_local = (tuple<int> *)func;
  tVar1 = std::
          apply<sl::functional::detail::call_bind_back<std::greater<void>&,std::tuple<int>&,int&>(std::greater<void>&,std::tuple<int>&,int&)::_lambda<typename____T0>((_T0&&)___)_1_,std::tuple<int>&>
                    (&local_30,boundArgsTuple);
  return tVar1;
}

Assistant:

constexpr decltype(auto) call_bind_back(Fn&& func, BoundArgsTuple&& boundArgsTuple, CallArgs&&... callArgs)
	{
		return std::apply(
			[&]<class... TArgs>(TArgs&&... boundArgs) -> decltype(auto)
			{
				return std::invoke(
					std::forward<Fn>(func),
					std::forward<CallArgs>(callArgs)...,
					std::forward<TArgs>(boundArgs)...);
			},
			std::forward<BoundArgsTuple>(boundArgsTuple));
	}